

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

Vec_Wrd_t * Maj3_ManTruthTables(Maj3_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *pVVar3;
  word *pwVar4;
  int local_1c;
  int nMints;
  int i;
  Vec_Wrd_t *vInfo;
  Maj3_Man_t *p_local;
  
  pVVar3 = Vec_WrdStart(p->nWords * (p->nObjs + 1));
  p->vInfo = pVVar3;
  iVar1 = Abc_MaxInt(0x40,1 << ((byte)p->nVars & 0x1f));
  for (local_1c = 0; local_1c < p->nVars; local_1c = local_1c + 1) {
    pwVar4 = Maj3_ManTruth(p,local_1c);
    Abc_TtIthVar(pwVar4,local_1c,p->nVars);
  }
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    iVar2 = Maj3_ManValue(local_1c,p->nVars);
    if (iVar2 != 0) {
      pwVar4 = Maj3_ManTruth(p,p->nObjs);
      Abc_TtSetBit(pwVar4,local_1c);
    }
  }
  return pVVar3;
}

Assistant:

Vec_Wrd_t * Maj3_ManTruthTables( Maj3_Man_t * p )
{
    Vec_Wrd_t * vInfo = p->vInfo = Vec_WrdStart( p->nWords * (p->nObjs + 1) ); 
    int i, nMints = Abc_MaxInt( 64, 1 << p->nVars );
    for ( i = 0; i < p->nVars; i++ )
        Abc_TtIthVar( Maj3_ManTruth(p, i), i, p->nVars );
    for ( i = 0; i < nMints; i++ )
        if ( Maj3_ManValue(i, p->nVars) )
            Abc_TtSetBit( Maj3_ManTruth(p, p->nObjs), i );
    //Dau_DsdPrintFromTruth( Maj3_ManTruth(p, p->nObjs), p->nVars );
    return vInfo;
}